

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,char *message)

{
  size_t sVar1;
  char *__s;
  long *local_50 [2];
  long local_40 [2];
  
  __s = "(null)";
  if (message != (char *)0x0) {
    __s = message;
  }
  local_50[0] = local_40;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__s,__s + sVar1);
  testing::ScopedTrace::PushTrace(this,file,line,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const char* message) {
    PushTrace(file, line, message ? message : "(null)");
  }